

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_abort_va(char *format,__va_list_tag *ap)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  size_t __n;
  int mpi_init;
  char buffer [200];
  char local_f8 [208];
  
  MPI_Initialized();
  s_aborting = 1;
  if (s_expect_abort_msg != (char *)0x0) {
    vsnprintf(local_f8,200,format,ap);
    __s2 = s_expect_abort_msg;
    sVar2 = strlen(s_expect_abort_msg);
    __n = 200;
    if (sVar2 < 200) {
      __n = sVar2;
    }
    iVar1 = strncmp(local_f8,__s2,__n);
    if (iVar1 == 0) {
      s_expect_abort_msg = (char *)0x0;
      exit(0);
    }
    bsp_abort_va_cold_2();
  }
  bsp_abort_va_cold_3();
  return;
}

Assistant:

void bsp_abort_va( const char * format, va_list ap )
{
    int mpi_init = 0;
    MPI_Initialized( & mpi_init );

    s_aborting = true;

    if (s_expect_abort_msg) {
        char buffer[200];
        std::vsnprintf(buffer, sizeof(buffer), format, ap );
        size_t len = strlen( s_expect_abort_msg );
        if (len > sizeof(buffer)) len = sizeof(buffer);
        // test equality of prefix
        if ( strncmp( buffer, s_expect_abort_msg, len ) == 0 ) {
            s_expect_abort_msg = NULL;
            if (mpi_init)
                MPI_Abort(MPI_COMM_WORLD, EXIT_SUCCESS );
            else
                std::exit(EXIT_SUCCESS);
        }
        std::fprintf( stderr, "Test did indeed abort, but produced wrong message.\n"
                "  Expected: '%s...'\n"
                "    Actual: '%s'\n", s_expect_abort_msg, buffer  );
    }
    std::fflush(stdout);
#if HAS_UNISTD
    fsync(STDOUT_FILENO);
#endif
    std::vfprintf(stderr, format, ap );
    std::fflush(stderr);
#if HAS_UNISTD
    fsync(STDERR_FILENO);
#endif

    if (mpi_init)
        MPI_Abort(MPI_COMM_WORLD, 6 );
    else
        std::abort();
}